

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_9::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint uVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  Fault f;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    uVar1 = fcntl64(*(undefined4 *)__fn,0x406,3);
    uVar2 = uVar1;
    if (-1 < (int)uVar1) goto LAB_001f7636;
    uVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (uVar2 == 0xffffffff);
  if (uVar2 == 0) {
LAB_001f7636:
    (this->fd).fd = uVar1;
  }
  else {
    if ((uVar2 != 0x16) && (uVar2 != 0x5f)) {
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_40);
    }
    do {
      __fd = dup(*(int *)__fn);
      if (-1 < __fd) goto LAB_001f7518;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
LAB_001f7518:
    (this->fd).fd = __fd;
    do {
      iVar3 = ioctl(__fd,0x5451);
      if (-1 < iVar3) {
        return iVar3;
      }
      uVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (uVar2 == 0xffffffff);
    if (uVar2 != 0) {
      if ((uVar2 != 0x16) && (uVar2 != 0x5f)) {
        local_40.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_40,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::~Fault(&local_40);
      }
      do {
        uVar1 = fcntl64(__fd,1);
        uVar2 = uVar1;
        if (-1 < (int)uVar1) goto LAB_001f75bf;
        uVar2 = kj::_::Debug::getOsErrorNumber(false);
      } while (uVar2 == 0xffffffff);
      if (uVar2 != 0) {
        local_40.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_40,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_40);
      }
LAB_001f75bf:
      if ((uVar1 & 1) == 0) {
        do {
          iVar3 = fcntl64(__fd,2,uVar1 | 1);
          if (-1 < iVar3) {
            return iVar3;
          }
          uVar2 = kj::_::Debug::getOsErrorNumber(false);
        } while (uVar2 == 0xffffffff);
        if (uVar2 != 0) {
          local_40.exception = (Exception *)0x0;
          local_38 = 0;
          uStack_30 = 0;
          kj::_::Debug::Fault::init
                    (&local_40,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_40);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

OwnFd clone() const {
#ifdef F_DUPFD_CLOEXEC
    int fd2;
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return OwnFd(fd2);
    }
#endif

    auto result = KJ_SYSCALL_FD(::dup(fd));
    setCloexec(result);
    return result;
  }